

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void __thiscall ImGuiTextBuffer::append(ImGuiTextBuffer *this,char *str,char *str_end)

{
  int new_capacity_00;
  size_t sVar1;
  char *pcVar2;
  long in_RDX;
  char *in_RSI;
  ImVector<char> *in_RDI;
  int new_capacity;
  int needed_sz;
  int write_off;
  int len;
  int in_stack_ffffffffffffffbc;
  undefined4 in_stack_ffffffffffffffc0;
  int in_stack_ffffffffffffffc4;
  int local_38;
  
  if (in_RDX == 0) {
    sVar1 = strlen(in_RSI);
    new_capacity_00 = (int)sVar1;
  }
  else {
    new_capacity_00 = (int)in_RDX - (int)in_RSI;
  }
  if (in_RDI->Size == 0) {
    local_38 = 1;
  }
  else {
    local_38 = in_RDI->Size;
  }
  if (in_RDI->Capacity <= local_38 + new_capacity_00) {
    in_stack_ffffffffffffffc4 = in_RDI->Capacity << 1;
    if (in_stack_ffffffffffffffc4 < local_38 + new_capacity_00) {
      in_stack_ffffffffffffffc4 = local_38 + new_capacity_00;
    }
    ImVector<char>::reserve(in_RDI,new_capacity_00);
  }
  ImVector<char>::resize
            ((ImVector<char> *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
             in_stack_ffffffffffffffbc);
  pcVar2 = ImVector<char>::operator[]
                     ((ImVector<char> *)
                      CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                      in_stack_ffffffffffffffbc);
  memcpy(pcVar2,in_RSI,(long)new_capacity_00);
  pcVar2 = ImVector<char>::operator[]
                     ((ImVector<char> *)
                      CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                      in_stack_ffffffffffffffbc);
  *pcVar2 = '\0';
  return;
}

Assistant:

void ImGuiTextBuffer::append(const char* str, const char* str_end)
{
    int len = str_end ? (int)(str_end - str) : (int)strlen(str);

    // Add zero-terminator the first time
    const int write_off = (Buf.Size != 0) ? Buf.Size : 1;
    const int needed_sz = write_off + len;
    if (write_off + len >= Buf.Capacity)
    {
        int new_capacity = Buf.Capacity * 2;
        Buf.reserve(needed_sz > new_capacity ? needed_sz : new_capacity);
    }

    Buf.resize(needed_sz);
    memcpy(&Buf[write_off - 1], str, (size_t)len);
    Buf[write_off - 1 + len] = 0;
}